

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O1

void __thiscall clip_model_loader::load_hparams(clip_model_loader *this)

{
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *puVar1;
  projector_type pVar2;
  clip_ctx *pcVar3;
  _Base_ptr __n;
  undefined8 uVar4;
  size_type sVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  _Rb_tree_node_base *p_Var9;
  long lVar10;
  long lVar11;
  undefined8 uVar12;
  runtime_error *this_00;
  _Rb_tree_color _Var13;
  char *pcVar14;
  int i;
  long lVar15;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *puVar16;
  __hashtable *__h;
  int *layer;
  _Alloc_hider _Var17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  string proj_type;
  vector<int,_std::allocator<int>_> vision_feature_layer;
  undefined1 local_78 [32];
  string local_58;
  clip_ctx *local_38;
  
  pcVar3 = this->ctx_clip;
  local_78._0_8_ = local_78 + 0x10;
  local_78._8_8_ = (_Base_ptr)0x0;
  local_78[0x10] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"clip.projector_type","");
  get_string(this,&local_58,(string *)local_78,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  uVar4 = local_78._8_8_;
  uVar12 = local_78._0_8_;
  local_38 = pcVar3;
  if ((_Base_ptr)local_78._8_8_ != (_Base_ptr)0x0) {
    _Var13 = 10;
    p_Var9 = PROJECTOR_TYPE_NAMES_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)
        PROJECTOR_TYPE_NAMES_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
        &PROJECTOR_TYPE_NAMES_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
      do {
        __n = p_Var9[1]._M_left;
        if (__n == (_Base_ptr)uVar4) {
          if (__n == (_Base_ptr)0x0) {
            bVar18 = true;
          }
          else {
            iVar6 = bcmp(p_Var9[1]._M_parent,(void *)uVar12,(size_t)__n);
            bVar18 = iVar6 == 0;
          }
        }
        else {
          bVar18 = false;
        }
        if (bVar18) {
          _Var13 = p_Var9[1]._M_color;
          goto LAB_00130f7b;
        }
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
      } while ((_Rb_tree_header *)p_Var9 !=
               &PROJECTOR_TYPE_NAMES_abi_cxx11_._M_t._M_impl.super__Rb_tree_header);
      _Var13 = 10;
    }
LAB_00130f7b:
    this->ctx_clip->proj_type = _Var13;
  }
  pcVar3 = local_38;
  puVar16 = (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
            (local_78 + 0x10);
  if (this->ctx_clip->proj_type == PROJECTOR_TYPE_UNKNOWN) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    string_format_abi_cxx11_
              (&local_58,"%s: unknown projector type: %s\n","load_hparams",local_78._0_8_);
    std::runtime_error::runtime_error(this_00,(string *)&local_58);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)local_78._0_8_
      != puVar16) {
    operator_delete((void *)local_78._0_8_,CONCAT71(local_78._17_7_,local_78[0x10]) + 1);
  }
  local_78._0_8_ = puVar16;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"clip.has_text_encoder","");
  get_bool(this,(string *)local_78,&this->ctx_clip->has_text_encoder,false);
  if ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)local_78._0_8_
      != puVar16) {
    operator_delete((void *)local_78._0_8_,CONCAT71(local_78._17_7_,local_78[0x10]) + 1);
  }
  local_78._0_8_ = puVar16;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"clip.has_vision_encoder","");
  get_bool(this,(string *)local_78,&this->ctx_clip->has_vision_encoder,false);
  if ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)local_78._0_8_
      != puVar16) {
    operator_delete((void *)local_78._0_8_,CONCAT71(local_78._17_7_,local_78[0x10]) + 1);
  }
  if (this->ctx_clip->has_vision_encoder == false) {
    pcVar14 = "ctx_clip.has_vision_encoder";
    uVar12 = 0x59d;
  }
  else if (this->ctx_clip->has_text_encoder == true) {
    pcVar14 = "!ctx_clip.has_text_encoder";
    uVar12 = 0x59e;
  }
  else {
    local_78._0_8_ = puVar16;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_78,"clip.has_llava_projector","");
    get_bool(this,(string *)local_78,&this->ctx_clip->has_llava_projector,false);
    if ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
        local_78._0_8_ != puVar16) {
      operator_delete((void *)local_78._0_8_,CONCAT71(local_78._17_7_,local_78[0x10]) + 1);
    }
    local_78._0_8_ = puVar16;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_78,"clip.has_minicpmv_projector","");
    get_bool(this,(string *)local_78,&this->ctx_clip->has_minicpmv_projector,false);
    if ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
        local_78._0_8_ != puVar16) {
      operator_delete((void *)local_78._0_8_,CONCAT71(local_78._17_7_,local_78[0x10]) + 1);
    }
    local_78._0_8_ = puVar16;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"clip.minicpmv_version","");
    get_i32(this,(string *)local_78,&this->ctx_clip->minicpmv_version,false);
    if ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
        local_78._0_8_ != puVar16) {
      operator_delete((void *)local_78._0_8_,CONCAT71(local_78._17_7_,local_78[0x10]) + 1);
    }
    local_78._0_8_ = puVar16;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"clip.has_glm_projector","");
    get_bool(this,(string *)local_78,&this->ctx_clip->has_glm_projector,false);
    if ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
        local_78._0_8_ != puVar16) {
      operator_delete((void *)local_78._0_8_,CONCAT71(local_78._17_7_,local_78[0x10]) + 1);
    }
    local_78._0_8_ = puVar16;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"clip.has_qwen2vl_merger","")
    ;
    get_bool(this,(string *)local_78,&this->ctx_clip->has_qwen2vl_merger,false);
    if ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
        local_78._0_8_ != puVar16) {
      operator_delete((void *)local_78._0_8_,CONCAT71(local_78._17_7_,local_78[0x10]) + 1);
    }
    local_78._0_8_ = puVar16;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"clip.use_gelu","");
    get_bool(this,(string *)local_78,&this->ctx_clip->use_gelu,false);
    if ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
        local_78._0_8_ != puVar16) {
      operator_delete((void *)local_78._0_8_,CONCAT71(local_78._17_7_,local_78[0x10]) + 1);
    }
    local_78._0_8_ = puVar16;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"clip.use_silu","");
    get_bool(this,(string *)local_78,&this->ctx_clip->use_silu,false);
    if ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
        local_78._0_8_ != puVar16) {
      operator_delete((void *)local_78._0_8_,CONCAT71(local_78._17_7_,local_78[0x10]) + 1);
    }
    string_format_abi_cxx11_((string *)local_78,"clip.%s.embedding_length","vision");
    get_u32(this,(string *)local_78,&(pcVar3->vision_model).hparams.hidden_size,true);
    if ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
        local_78._0_8_ != puVar16) {
      operator_delete((void *)local_78._0_8_,CONCAT71(local_78._17_7_,local_78[0x10]) + 1);
    }
    string_format_abi_cxx11_((string *)local_78,"clip.%s.attention.head_count","vision");
    get_u32(this,(string *)local_78,&(pcVar3->vision_model).hparams.n_head,true);
    if ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
        local_78._0_8_ != puVar16) {
      operator_delete((void *)local_78._0_8_,CONCAT71(local_78._17_7_,local_78[0x10]) + 1);
    }
    string_format_abi_cxx11_((string *)local_78,"clip.%s.feed_forward_length","vision");
    get_u32(this,(string *)local_78,&(pcVar3->vision_model).hparams.n_intermediate,true);
    if ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
        local_78._0_8_ != puVar16) {
      operator_delete((void *)local_78._0_8_,CONCAT71(local_78._17_7_,local_78[0x10]) + 1);
    }
    string_format_abi_cxx11_((string *)local_78,"clip.%s.block_count","vision");
    get_u32(this,(string *)local_78,&(pcVar3->vision_model).hparams.n_layer,true);
    if ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
        local_78._0_8_ != puVar16) {
      operator_delete((void *)local_78._0_8_,CONCAT71(local_78._17_7_,local_78[0x10]) + 1);
    }
    string_format_abi_cxx11_((string *)local_78,"clip.%s.projection_dim","vision");
    get_u32(this,(string *)local_78,&(pcVar3->vision_model).hparams.projection_dim,true);
    if ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
        local_78._0_8_ != puVar16) {
      operator_delete((void *)local_78._0_8_,CONCAT71(local_78._17_7_,local_78[0x10]) + 1);
    }
    string_format_abi_cxx11_((string *)local_78,"clip.%s.attention.layer_norm_epsilon","vision");
    get_f32(this,(string *)local_78,&(pcVar3->vision_model).hparams.eps,true);
    if ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
        local_78._0_8_ != puVar16) {
      operator_delete((void *)local_78._0_8_,CONCAT71(local_78._17_7_,local_78[0x10]) + 1);
    }
    local_78._0_8_ = puVar16;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"clip.vision.image_size","");
    get_u32(this,(string *)local_78,(int *)&pcVar3->vision_model,true);
    if ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
        local_78._0_8_ != puVar16) {
      operator_delete((void *)local_78._0_8_,CONCAT71(local_78._17_7_,local_78[0x10]) + 1);
    }
    local_78._0_8_ = puVar16;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"clip.vision.patch_size","");
    get_u32(this,(string *)local_78,&(pcVar3->vision_model).hparams.patch_size,true);
    if ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
        local_78._0_8_ != puVar16) {
      operator_delete((void *)local_78._0_8_,CONCAT71(local_78._17_7_,local_78[0x10]) + 1);
    }
    local_78._0_8_ = puVar16;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_78,"clip.vision.image_crop_resolution","");
    get_u32(this,(string *)local_78,&(pcVar3->vision_model).hparams.image_crop_resolution,false);
    if ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
        local_78._0_8_ != puVar16) {
      operator_delete((void *)local_78._0_8_,CONCAT71(local_78._17_7_,local_78[0x10]) + 1);
    }
    local_78._0_8_ = puVar16;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_78,"clip.vision.image_grid_pinpoints","");
    get_arr_int(this,(string *)local_78,&(pcVar3->vision_model).hparams.image_grid_pinpoints,false);
    if ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
        local_78._0_8_ != puVar16) {
      operator_delete((void *)local_78._0_8_,CONCAT71(local_78._17_7_,local_78[0x10]) + 1);
    }
    local_78._8_8_ = (_Base_ptr)0x0;
    local_78[0x10] = '\0';
    local_78._0_8_ = puVar16;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"clip.vision.mm_patch_merge_type","");
    get_string(this,&local_58,(string *)local_78,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    iVar6 = std::__cxx11::string::compare(local_78);
    if (iVar6 == 0) {
      (pcVar3->vision_model).hparams.mm_patch_merge_type = PATCH_MERGE_SPATIAL_UNPAD;
    }
    if ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
        local_78._0_8_ != puVar16) {
      operator_delete((void *)local_78._0_8_,CONCAT71(local_78._17_7_,local_78[0x10]) + 1);
    }
    uVar7 = gguf_find_key((this->ctx_gguf)._M_t.
                          super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                          super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                          super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,
                          "clip.vision.image_mean");
    uVar8 = gguf_find_key((this->ctx_gguf)._M_t.
                          super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                          super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                          super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,
                          "clip.vision.image_std");
    if ((int)uVar7 < 0) {
      pcVar14 = "idx_mean >= 0 && \"image_mean not found\"";
      uVar12 = 0x5c1;
    }
    else {
      if (-1 < (int)uVar8) {
        lVar10 = gguf_get_arr_data((this->ctx_gguf)._M_t.
                                   super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                                   super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                                   super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,
                                   uVar7 & 0x7fffffff);
        lVar11 = gguf_get_arr_data((this->ctx_gguf)._M_t.
                                   super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                                   super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                                   super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,
                                   uVar8 & 0x7fffffff);
        pcVar3 = this->ctx_clip;
        lVar15 = 0;
        do {
          pcVar3->image_mean[lVar15] = *(float *)(lVar10 + lVar15 * 4);
          pcVar3->image_std[lVar15] = *(float *)(lVar11 + lVar15 * 4);
          lVar15 = lVar15 + 1;
        } while (lVar15 != 3);
        local_58._M_dataplus._M_p = (pointer)0x0;
        local_58._M_string_length = 0;
        local_58.field_2._M_allocated_capacity = 0;
        local_78._0_8_ = puVar16;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_78,"clip.vision.feature_layer","");
        get_arr_int(this,(string *)local_78,(vector<int,_std::allocator<int>_> *)&local_58,false);
        if ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
            local_78._0_8_ != puVar16) {
          operator_delete((void *)local_78._0_8_,CONCAT71(local_78._17_7_,local_78[0x10]) + 1);
        }
        sVar5 = local_58._M_string_length;
        if (local_58._M_dataplus._M_p != (pointer)local_58._M_string_length) {
          puVar1 = &(local_38->vision_model).hparams.vision_feature_layer;
          _Var17._M_p = local_58._M_dataplus._M_p;
          do {
            local_78._0_8_ = puVar1;
            std::
            _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
                      ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)puVar1,_Var17._M_p,local_78);
            _Var17._M_p = _Var17._M_p + 4;
          } while (_Var17._M_p != (pointer)sVar5);
        }
        pcVar3 = this->ctx_clip;
        iVar6 = get_deepest_feature_layer(pcVar3);
        pcVar3->max_feature_layer = iVar6;
        if ((int)g_logger_state.verbosity_thold < 3) {
          clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: text_encoder:       %d\n","load_hparams");
        }
        if ((int)g_logger_state.verbosity_thold < 3) {
          clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: vision_encoder:     %d\n","load_hparams");
        }
        if ((int)g_logger_state.verbosity_thold < 3) {
          clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: llava_projector:    %d\n","load_hparams");
        }
        if ((int)g_logger_state.verbosity_thold < 3) {
          clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: minicpmv_projector: %d\n","load_hparams");
        }
        if ((int)g_logger_state.verbosity_thold < 3) {
          clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: minicpmv_version:   %d\n","load_hparams");
        }
        if ((int)g_logger_state.verbosity_thold < 3) {
          clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: glm_projector:      %d\n","load_hparams");
        }
        if ((int)g_logger_state.verbosity_thold < 3) {
          auVar19._0_8_ = (double)CONCAT44(0x43300000,(int)this->model_size);
          auVar19._8_4_ = (int)(this->model_size >> 0x20);
          auVar19._12_4_ = 0x45300000;
          clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: model size:         %.2f MiB\n",
                            SUB84(((auVar19._8_8_ - 1.9342813113834067e+25) +
                                  (auVar19._0_8_ - 4503599627370496.0)) * 0.0009765625 *
                                  0.0009765625,0),"load_hparams");
        }
        if ((int)g_logger_state.verbosity_thold < 3) {
          uVar12 = ggml_get_mem_size((this->ctx_meta)._M_t.
                                     super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                                     super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                                     super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl);
          auVar20._8_4_ = (int)((ulong)uVar12 >> 0x20);
          auVar20._0_8_ = uVar12;
          auVar20._12_4_ = 0x45300000;
          clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: metadata size:      %.2f MiB\n",
                            SUB84(((auVar20._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)uVar12) - 4503599627370496.0)) *
                                  0.0009765625 * 0.0009765625,0),"load_hparams");
        }
        pcVar3 = local_38;
        if (local_58._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(local_58._M_dataplus._M_p,
                          local_58.field_2._M_allocated_capacity - (long)local_58._M_dataplus._M_p);
        }
        pVar2 = this->ctx_clip->proj_type;
        if (pVar2 == PROJECTOR_TYPE_IDEFICS3) {
          local_78._0_8_ = puVar16;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_78,"clip.vision.projector.scale_factor","");
          get_u32(this,(string *)local_78,&(pcVar3->vision_model).hparams.proj_scale_factor,false);
          if ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
              local_78._0_8_ != puVar16) {
            operator_delete((void *)local_78._0_8_,CONCAT71(local_78._17_7_,local_78[0x10]) + 1);
          }
        }
        else if (pVar2 == PROJECTOR_TYPE_PIXTRAL) {
          (pcVar3->vision_model).hparams.rope_theta = 10000.0;
        }
        return;
      }
      pcVar14 = "idx_std >= 0 && \"image_std not found\"";
      uVar12 = 0x5c2;
    }
  }
  uVar12 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llava/clip.cpp"
                      ,uVar12,"GGML_ASSERT(%s) failed",pcVar14);
  if ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)local_78._0_8_
      != puVar16) {
    operator_delete((void *)local_78._0_8_,CONCAT71(local_78._17_7_,local_78[0x10]) + 1);
  }
  _Unwind_Resume(uVar12);
}

Assistant:

void load_hparams() {
        auto & hparams = ctx_clip.vision_model.hparams;

        // projector type
        {
            std::string proj_type;
            get_string(KEY_PROJ_TYPE, proj_type, false);
            if (!proj_type.empty()) {
                ctx_clip.proj_type = clip_projector_type_from_string(proj_type);
            }
            if (ctx_clip.proj_type == PROJECTOR_TYPE_UNKNOWN) {
                throw std::runtime_error(string_format("%s: unknown projector type: %s\n", __func__, proj_type.c_str()));
            }
        }

        // other hparams
        {
            get_bool(KEY_HAS_TEXT_ENC, ctx_clip.has_text_encoder, false);
            get_bool(KEY_HAS_VIS_ENC, ctx_clip.has_vision_encoder, false);
            GGML_ASSERT(ctx_clip.has_vision_encoder);
            GGML_ASSERT(!ctx_clip.has_text_encoder);

            // legacy keys, use KEY_PROJ_TYPE instead
            get_bool(KEY_HAS_LLAVA_PROJ, ctx_clip.has_llava_projector, false);
            get_bool(KEY_HAS_MINICPMV_PROJ, ctx_clip.has_minicpmv_projector, false);
            get_i32(KEY_MINICPMV_VERSION, ctx_clip.minicpmv_version, false);
            get_bool(KEY_HAS_GLM_PROJ, ctx_clip.has_glm_projector, false);
            get_bool(KEY_HAS_QWEN2VL_MERGER, ctx_clip.has_qwen2vl_merger, false);
            // !!! do NOT extend the list above, use KEY_PROJ_TYPE instead

            get_bool(KEY_USE_GELU, ctx_clip.use_gelu, false);
            get_bool(KEY_USE_SILU, ctx_clip.use_silu, false);

            get_u32(string_format(KEY_N_EMBD,         "vision"), hparams.hidden_size);
            get_u32(string_format(KEY_N_HEAD,         "vision"), hparams.n_head);
            get_u32(string_format(KEY_N_FF,           "vision"), hparams.n_intermediate);
            get_u32(string_format(KEY_N_BLOCK,        "vision"), hparams.n_layer);
            get_u32(string_format(KEY_PROJ_DIM,       "vision"), hparams.projection_dim);
            get_f32(string_format(KEY_LAYER_NORM_EPS, "vision"), hparams.eps);
            get_u32(KEY_IMAGE_SIZE, hparams.image_size);
            get_u32(KEY_PATCH_SIZE, hparams.patch_size);
            get_u32(KEY_IMAGE_CROP_RESOLUTION, hparams.image_crop_resolution, false);
            get_arr_int(KEY_IMAGE_GRID_PINPOINTS, hparams.image_grid_pinpoints, false);

            {
                std::string mm_patch_merge_type;
                get_string(KEY_MM_PATCH_MERGE_TYPE, mm_patch_merge_type, false);
                if (mm_patch_merge_type == "spatial_unpad") {
                    hparams.mm_patch_merge_type = PATCH_MERGE_SPATIAL_UNPAD;
                }
            }

            {
                int idx_mean = gguf_find_key(ctx_gguf.get(), KEY_IMAGE_MEAN);
                int idx_std  = gguf_find_key(ctx_gguf.get(), KEY_IMAGE_STD);
                GGML_ASSERT(idx_mean >= 0 && "image_mean not found");
                GGML_ASSERT(idx_std >= 0  && "image_std not found");
                const float * mean_data = (const float *) gguf_get_arr_data(ctx_gguf.get(), idx_mean);
                const float * std_data  = (const float *) gguf_get_arr_data(ctx_gguf.get(), idx_std);
                for (int i = 0; i < 3; ++i) {
                    ctx_clip.image_mean[i] = mean_data[i];
                    ctx_clip.image_std[i]  = std_data[i];
                }
            }

            // Load the vision feature layer indices if they are explicitly provided;
            // if multiple vision feature layers are present, the values will be concatenated
            // to form the final visual features.
            // NOTE: gguf conversions should standardize the values of the vision feature layer to
            // be non-negative, since we use -1 to mark values as unset here.
            std::vector<int> vision_feature_layer;
            get_arr_int(KEY_FEATURE_LAYER, vision_feature_layer, false);
            // convert std::vector to std::unordered_set
            for (auto & layer : vision_feature_layer) {
                hparams.vision_feature_layer.insert(layer);
            }
            // Calculate the deepest feature layer based on hparams and projector type
            ctx_clip.max_feature_layer = get_deepest_feature_layer(&ctx_clip);

            LOG_INF("%s: text_encoder:       %d\n", __func__, ctx_clip.has_text_encoder);
            LOG_INF("%s: vision_encoder:     %d\n", __func__, ctx_clip.has_vision_encoder);
            LOG_INF("%s: llava_projector:    %d\n", __func__, ctx_clip.has_llava_projector);
            LOG_INF("%s: minicpmv_projector: %d\n", __func__, ctx_clip.has_minicpmv_projector);
            LOG_INF("%s: minicpmv_version:   %d\n", __func__, ctx_clip.minicpmv_version);
            LOG_INF("%s: glm_projector:      %d\n", __func__, ctx_clip.has_glm_projector);
            LOG_INF("%s: model size:         %.2f MiB\n", __func__, model_size / 1024.0 / 1024.0);
            LOG_INF("%s: metadata size:      %.2f MiB\n", __func__, ggml_get_mem_size(ctx_meta.get()) / 1024.0 / 1024.0);
        }

        // model-specific params
        switch (ctx_clip.proj_type) {
            case PROJECTOR_TYPE_IDEFICS3:
                {
                    get_u32(KEY_PROJ_SCALE_FACTOR, hparams.proj_scale_factor, false);
                } break;
            case PROJECTOR_TYPE_PIXTRAL:
                {
                    hparams.rope_theta = 10000.0f;
                } break;
            default:
                break;
        }
    }